

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O1

void __thiscall
mocker::ir::BuilderContext::BuilderContext
          (BuilderContext *this,ASTIDMap<std::shared_ptr<mocker::ast::Type>_> *exprType,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *doNotTranslate)

{
  Module *this_00;
  FunctionModule *this_01;
  string local_168;
  string local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  FunctionModule local_108;
  
  (this->logicalExprInfo).empty = true;
  (this->logicalExprInfo).trueNext._M_node = (_List_node_base *)0x0;
  (this->logicalExprInfo).falseNext._M_node = (_List_node_base *)0x0;
  (this->logicalExprInfo).inCondition = false;
  (this->exprAddr)._M_h._M_buckets = &(this->exprAddr)._M_h._M_single_bucket;
  (this->exprAddr)._M_h._M_bucket_count = 1;
  (this->exprAddr)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exprAddr)._M_h._M_element_count = 0;
  (this->exprAddr)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exprAddr)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exprAddr)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->exprType = exprType;
  (this->bbReside)._M_h._M_buckets = &(this->bbReside)._M_h._M_single_bucket;
  (this->bbReside)._M_h._M_bucket_count = 1;
  (this->bbReside)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->bbReside)._M_h._M_element_count = 0;
  (this->bbReside)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->bbReside)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->bbReside)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->loopEntry).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
                       *)&this->loopEntry,0);
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->loopSuccessor).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
                       *)&this->loopSuccessor,0);
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->loopUpdate).c.
  super__Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<mocker::ir::Label>,_std::allocator<std::shared_ptr<mocker::ir::Label>_>_>
                       *)&this->loopUpdate,0);
  (this->classLayout)._M_h._M_buckets = &(this->classLayout)._M_h._M_single_bucket;
  (this->classLayout)._M_h._M_bucket_count = 1;
  (this->classLayout)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->classLayout)._M_h._M_element_count = 0;
  (this->classLayout)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->classLayout)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->classLayout)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->strLits)._M_h._M_buckets = &(this->strLits)._M_h._M_single_bucket;
  (this->strLits)._M_h._M_bucket_count = 1;
  (this->strLits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->strLits)._M_h._M_element_count = 0;
  (this->strLits)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->strLits)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->strLits)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->trivialExpr)._M_h._M_buckets = &(this->trivialExpr)._M_h._M_single_bucket;
  (this->trivialExpr)._M_h._M_bucket_count = 1;
  (this->trivialExpr)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->trivialExpr)._M_h._M_element_count = 0;
  (this->trivialExpr)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->trivialExpr)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->trivialExpr)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_00 = &this->module;
  (this->module).globalVars.
  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->module).globalVars.
  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->module).globalVars.
  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>._M_impl._M_node.
  _M_size = 0;
  (this->module).funcs._M_h._M_buckets = &(this->module).funcs._M_h._M_single_bucket;
  (this->module).funcs._M_h._M_bucket_count = 1;
  (this->module).funcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->module).funcs._M_h._M_element_count = 0;
  (this->module).funcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->curFunc = (FunctionModule *)0x0;
  this->strLitCounter = 0;
  (this->curBasicBlock)._M_node = (_List_node_base *)0x0;
  (this->module).funcs._M_h._M_rehash_policy._M_next_resize = 0;
  (this->module).funcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->doNotTranslate = doNotTranslate;
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"_init_global_vars","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"_init_global_vars","");
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FunctionModule::FunctionModule(&local_108,&local_168,&local_128,false);
  this_01 = Module::addFunc(this_00,&local_148,&local_108);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.predecessors._M_h);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_108.bbMap._M_h);
  std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
  _M_clear(&local_108.bbs.
            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.identifier._M_dataplus._M_p != &local_108.identifier.field_2) {
    operator_delete(local_108.identifier._M_dataplus._M_p,
                    local_108.identifier.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  FunctionModule::pushBackBB(this_01);
  return;
}

Assistant:

BuilderContext(const ASTIDMap<std::shared_ptr<mocker::ast::Type>> &exprType,
                 const std::unordered_set<ast::NodeID> &doNotTranslate)
      : exprType(exprType), doNotTranslate(doNotTranslate) {
    auto &initGlobalVars = module.addFunc(
        "_init_global_vars", FunctionModule{"_init_global_vars", {}});
    initGlobalVars.pushBackBB();
  }